

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O1

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>::
DependentQuantityD(DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>
                   *this,MeshData<geometrycentral::surface::Edge,_double> *dataBuffer_,
                  function<void_()> *evaluateFunc_,
                  vector<geometrycentral::DependentQuantity_*,_std::allocator<geometrycentral::DependentQuantity_*>_>
                  *listToJoin)

{
  _Any_data local_40;
  code *local_30;
  
  std::function<void_()>::function((function<void_()> *)&local_40,evaluateFunc_);
  DependentQuantity::DependentQuantity
            (&this->super_DependentQuantity,(function<void_()> *)&local_40,listToJoin);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  (this->super_DependentQuantity)._vptr_DependentQuantity =
       (_func_int **)&PTR__DependentQuantity_004b87e0;
  this->dataBuffer = dataBuffer_;
  return;
}

Assistant:

DependentQuantityD(D* dataBuffer_, std::function<void()> evaluateFunc_, std::vector<DependentQuantity*>& listToJoin)
      : DependentQuantity(evaluateFunc_, listToJoin), dataBuffer(dataBuffer_) {}